

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O2

int __thiscall amrex::BndryData::init(BndryData *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  undefined8 extraout_RAX_00;
  long lVar3;
  Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *this_00;
  
  memcpy(&this->geom,ctx + 0xba8,200);
  this->m_ncomp = *(int *)(ctx + 0xc70);
  this->m_defined = (bool)ctx[0xc74];
  LayoutData<std::array<double,_6UL>_>::operator=
            (&this->bcloc,(LayoutData<std::array<double,_6UL>_> *)(ctx + 0xa80));
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::operator=(&this->bcond,
              (LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
               *)(ctx + 0x970));
  this_00 = &this->masks;
  std::vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::clear
            (&this_00->super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>);
  std::vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::resize
            (&this_00->super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>,6);
  uVar2 = extraout_RAX;
  for (lVar3 = 0; lVar3 != 0x900; lVar3 = lVar3 + 0x180) {
    lVar1 = *(long *)(ctx + 0xb90);
    MultiMask::define((MultiMask *)
                      ((long)&(((this_00->
                                super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>).
                                super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_fa).super_FabArrayBase
                      + lVar3),(BoxArray *)(lVar1 + lVar3 + 8),
                      (DistributionMapping *)(lVar1 + lVar3 + 0x70),*(int *)(lVar1 + lVar3 + 0xcc));
    MultiMask::Copy((MultiMask *)
                    ((long)&(((this_00->
                              super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>).
                              super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_fa).super_FabArrayBase +
                    lVar3),(MultiMask *)(lVar1 + lVar3));
    uVar2 = extraout_RAX_00;
  }
  return (int)uVar2;
}

Assistant:

void
BndryData::init (const BndryData& src)
{
    geom      = src.geom;
    m_ncomp   = src.m_ncomp;
    m_defined = src.m_defined;
    bcloc     = src.bcloc;
    bcond     = src.bcond;

    masks.clear();
    masks.resize(2*AMREX_SPACEDIM);
    for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
    {
        const MultiMask& smasks = src.masks[i];
        masks[i].define(smasks.boxArray(), smasks.DistributionMap(), smasks.nComp());
        MultiMask::Copy(masks[i], smasks);
    }
}